

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Buffer.h
# Opt level: O3

void __thiscall hwnet::Buffer::Buffer(Buffer *this,size_t cap_,size_t l)

{
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  bytes *pbVar1;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var2;
  unsigned_long uVar3;
  bytes *local_48;
  __shared_count<(__gnu_cxx::_Lock_policy)2> a_Stack_40 [2];
  unsigned_long local_30;
  size_t cap__local;
  
  this->b = 0;
  this->len = 0;
  (this->buff).super___shared_ptr<hwnet::Buffer::bytes,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  (this->buff).super___shared_ptr<hwnet::Buffer::bytes,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  local_30 = cap_;
  if (cap_ < 0x10) {
    local_30 = 0x10;
  }
  uVar3 = local_30;
  local_48 = (element_type *)0x0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<hwnet::Buffer::bytes,std::allocator<hwnet::Buffer::bytes>,unsigned_long&>
            (a_Stack_40,&local_48,(allocator<hwnet::Buffer::bytes> *)((long)&cap__local + 7),
             &local_30);
  _Var2._M_pi = a_Stack_40[0]._M_pi;
  pbVar1 = local_48;
  local_48 = (bytes *)0x0;
  a_Stack_40[0]._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  this_00 = (this->buff).super___shared_ptr<hwnet::Buffer::bytes,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi;
  (this->buff).super___shared_ptr<hwnet::Buffer::bytes,_(__gnu_cxx::_Lock_policy)2>._M_ptr = pbVar1;
  (this->buff).super___shared_ptr<hwnet::Buffer::bytes,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = _Var2._M_pi;
  if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
    if (a_Stack_40[0]._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(a_Stack_40[0]._M_pi);
    }
  }
  if (uVar3 < l) {
    l = uVar3;
  }
  this->cap = local_30;
  this->len = l;
  return;
}

Assistant:

Buffer(size_t cap_,size_t l):b(0),len(0){
		if(cap_ < 16) {
			cap_ = 16;
		}
		
		if(l > cap_) {
			l = cap_;
		}

		this->buff = std::make_shared<bytes>(cap_);
		this->cap  = cap_;
		this->len  = l;
	}